

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_stbvorbis_get_length_in_pcm_frames(ma_stbvorbis *pVorbis,ma_uint64 *pLength)

{
  uint uVar1;
  ulong *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (in_RSI == (ulong *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    if (in_RDI == 0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      if (*(int *)(in_RDI + 0xa8) == 0) {
        uVar1 = stb_vorbis_stream_length_in_samples((stb_vorbis *)pVorbis);
        *in_RSI = (ulong)uVar1;
      }
      else {
        *in_RSI = 0;
      }
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_stbvorbis_get_length_in_pcm_frames(ma_stbvorbis* pVorbis, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;   /* Safety. */

    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        if (pVorbis->usingPushMode) {
            *pLength = 0;   /* I don't know of a good way to determine this reliably with stb_vorbis and push mode. */
        } else {
            *pLength = stb_vorbis_stream_length_in_samples(pVorbis->stb);
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}